

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cc
# Opt level: O0

Histogram * __thiscall leveldb::Histogram::ToString_abi_cxx11_(Histogram *this)

{
  Histogram *in_RSI;
  double dVar1;
  double dVar2;
  double dVar3;
  undefined8 local_158;
  double local_140;
  int local_fc;
  int marks;
  int b;
  double sum;
  double mult;
  char buf [200];
  Histogram *this_local;
  string *r;
  
  buf[199] = '\0';
  std::__cxx11::string::string((string *)this);
  dVar3 = in_RSI->num_;
  dVar1 = Average(in_RSI);
  dVar2 = StandardDeviation(in_RSI);
  snprintf((char *)&mult,200,"Count: %.0f  Average: %.4f  StdDev: %.2f\n",dVar3,dVar1,dVar2);
  std::__cxx11::string::append((char *)this);
  if ((in_RSI->num_ != 0.0) || (NAN(in_RSI->num_))) {
    local_140 = in_RSI->min_;
  }
  else {
    local_140 = 0.0;
  }
  dVar3 = Median(in_RSI);
  snprintf((char *)&mult,200,"Min: %.4f  Median: %.4f  Max: %.4f\n",local_140,dVar3,in_RSI->max_);
  std::__cxx11::string::append((char *)this);
  std::__cxx11::string::append((char *)this);
  dVar3 = 100.0 / in_RSI->num_;
  _marks = 0.0;
  for (local_fc = 0; local_fc < 0x9a; local_fc = local_fc + 1) {
    if (0.0 < in_RSI->buckets_[local_fc]) {
      _marks = in_RSI->buckets_[local_fc] + _marks;
      if (local_fc == 0) {
        local_158 = 0;
      }
      else {
        local_158 = *(undefined8 *)(kBucketLimit + (long)(local_fc + -1) * 8);
      }
      snprintf((char *)&mult,200,"[ %7.0f, %7.0f ) %7.0f %7.3f%% %7.3f%% ",local_158,
               *(undefined8 *)(kBucketLimit + (long)local_fc * 8),in_RSI->buckets_[local_fc],
               dVar3 * in_RSI->buckets_[local_fc],dVar3 * _marks);
      std::__cxx11::string::append((char *)this);
      std::__cxx11::string::append
                ((ulong)this,(char)(int)((in_RSI->buckets_[local_fc] / in_RSI->num_) * 20.0 + 0.5));
      std::__cxx11::string::push_back((char)this);
    }
  }
  return this;
}

Assistant:

std::string Histogram::ToString() const {
  std::string r;
  char buf[200];
  std::snprintf(buf, sizeof(buf), "Count: %.0f  Average: %.4f  StdDev: %.2f\n",
                num_, Average(), StandardDeviation());
  r.append(buf);
  std::snprintf(buf, sizeof(buf), "Min: %.4f  Median: %.4f  Max: %.4f\n",
                (num_ == 0.0 ? 0.0 : min_), Median(), max_);
  r.append(buf);
  r.append("------------------------------------------------------\n");
  const double mult = 100.0 / num_;
  double sum = 0;
  for (int b = 0; b < kNumBuckets; b++) {
    if (buckets_[b] <= 0.0) continue;
    sum += buckets_[b];
    std::snprintf(buf, sizeof(buf), "[ %7.0f, %7.0f ) %7.0f %7.3f%% %7.3f%% ",
                  ((b == 0) ? 0.0 : kBucketLimit[b - 1]),  // left
                  kBucketLimit[b],                         // right
                  buckets_[b],                             // count
                  mult * buckets_[b],                      // percentage
                  mult * sum);  // cumulative percentage
    r.append(buf);

    // Add hash marks based on percentage; 20 marks for 100%.
    int marks = static_cast<int>(20 * (buckets_[b] / num_) + 0.5);
    r.append(marks, '#');
    r.push_back('\n');
  }
  return r;
}